

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
 __thiscall
phmap::priv::
base_checker<phmap::btree_multimap<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::multimap<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
::
riter_check<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,true>>const,std::pair<long_const,long>const&,std::pair<long_const,long>const*>>,std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<long_const,long>>>>
          (base_checker<phmap::btree_multimap<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::multimap<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
           *this,reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
                 *tree_iter,
          reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>_>
          *checker_iter)

{
  bool bVar1;
  reference x;
  reference y;
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>_> *in_RCX;
  undefined8 extraout_RDX;
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
  rVar2;
  undefined1 local_40 [8];
  btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>_>
  local_38;
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>_> *checker_iter_local;
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
  *tree_iter_local;
  base_checker<phmap::btree_multimap<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  *this_local;
  
  checker_iter_local = checker_iter;
  tree_iter_local = tree_iter;
  this_local = (base_checker<phmap::btree_multimap<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                *)this;
  btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>_>
  ::rend((btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>_>
          *)(local_40 + 8));
  bVar1 = std::operator==((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
                           *)checker_iter,
                          (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
                           *)(local_40 + 8));
  if (bVar1) {
    std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::rend
              ((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                *)local_40);
    bVar1 = std::operator==(in_RCX,(reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>_>
                                    *)local_40);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x87,
                    "IterType phmap::priv::base_checker<phmap::btree_multimap<long, long>, std::multimap<long, long>>::riter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_multimap<long, long>, CheckerType = std::multimap<long, long>, IterType = std::reverse_iterator<phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, true>>, const std::pair<const long, long> &, const std::pair<const long, long> *>>, CheckerIterType = std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const long, long>>>]"
                   );
    }
  }
  else {
    x = std::
        reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
        ::operator*((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
                     *)checker_iter);
    y = std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>_>::
        operator*(in_RCX);
    (anonymous_namespace)::CheckPairEquals<long_const,long,long_const,long>(x,y);
  }
  std::
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
  ::reverse_iterator((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
                      *)this,(reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
                              *)checker_iter);
  rVar2.current._8_8_ = extraout_RDX;
  rVar2.current.node =
       (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
        *)this;
  return (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>_>
          )rVar2.current;
}

Assistant:

IterType riter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.rend()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.rend(),
                                 "Checker iterator not at rend.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }